

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_fold2_key.c
# Opt level: O0

int onigenc_unicode_fold2_key(OnigCodePoint *codes)

{
  uint uVar1;
  int iVar2;
  int index;
  int key;
  OnigCodePoint *codes_local;
  
  uVar1 = hash(codes);
  if (((0x3a < (int)uVar1) ||
      (codes_local._4_4_ = (int)onigenc_unicode_fold2_key::wordlist[(int)uVar1],
      codes_local._4_4_ < 0)) ||
     (iVar2 = onig_codes_cmp(codes,OnigUnicodeFolds2 + codes_local._4_4_,2), iVar2 != 0)) {
    codes_local._4_4_ = -1;
  }
  return codes_local._4_4_;
}

Assistant:

int
onigenc_unicode_fold2_key(OnigCodePoint codes[])
{
  static const short int wordlist[] =
    {

      101,

      253,

      76,

      29,

      24,

      239,

      96,

      71,

      92,

      67,

      4,

      62,

      8,

      58,

      234,

      109,

      164,

      88,

      84,

      80,

      214,

      0,

      54,

      261,

      50,

      105,

      121,

      125,

      257,

      42,

      38,

      249,

      46,

      117,

      12,

      113,

      244,

      229,

      224,

      219,

      209,

      16,

      204,

      199,

      194,

      189,

      184,

      179,

      174,

      169,

      20,

      34,

      159,

      154,

      149,

      144,

      139,

      134,

      129
    };


    {
      int key = hash(codes);

      if (key <= MAX_HASH_VALUE)
        {
          int index = wordlist[key];

          if (index >= 0 && onig_codes_cmp(codes, OnigUnicodeFolds2 + index, 2) == 0)
            return index;
        }
    }
  return -1;
}